

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trompeloeil.hpp
# Opt level: O2

void trompeloeil::print_mismatch<bool,int>(ostream *os,size_t num,bool *v,int *p)

{
  ostream *poVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> prefix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  if (*p != (uint)*v) {
    param_name_prefix_abi_cxx11_(&local_40,(trompeloeil *)v,v);
    std::operator+(&local_60,&local_40,"_");
    std::__cxx11::string::~string((string *)&local_40);
    poVar1 = std::operator<<(os,"  Expected ");
    *(ulong *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = (ulong)(num < 9) + 1;
    poVar1 = std::operator<<(poVar1,(string *)&local_60);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    print_expectation<bool>(os,v);
    std::__cxx11::string::~string((string *)&local_60);
  }
  return;
}

Assistant:

bool
  param_matches_impl(
    T const& t,
    U const& u,
    void const*)
  noexcept(noexcept(::trompeloeil::identity<U>(t) == u))
  {
    return ::trompeloeil::identity<U>(t) == u;
  }